

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O0

Pipeline * __thiscall
capnp::_::RpcSystemBase::RpcConnectionState::RpcRequest::sendForPipeline
          (Pipeline *__return_storage_ptr__,RpcRequest *this)

{
  Reader value;
  Reader reader;
  bool bVar1;
  uint16_t uVar2;
  RpcConnectionState *pRVar3;
  RpcClient *pRVar4;
  Own<capnp::ClientHook,_std::nullptr_t> *pOVar5;
  ClientHook *pCVar6;
  uint64_t uVar7;
  RefOrVoid<capnp::_::RpcSystemBase::RpcConnectionState> params;
  Own<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef,_std::nullptr_t> *params_1;
  Own<capnp::PipelineHook,_std::nullptr_t> *hook;
  undefined1 *__n;
  void *__buf;
  int in_R8D;
  MessageSize MVar8;
  undefined8 in_stack_fffffffffffffc48;
  undefined1 local_330 [16];
  undefined1 local_320 [8];
  Own<capnp::PipelineHook,_std::nullptr_t> pipeline;
  Own<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef,_std::nullptr_t> questionRef;
  Pipeline local_2f8;
  undefined4 local_2cc;
  Reader local_2c8;
  Reader local_2a8;
  undefined2 local_272;
  MessageSize local_270;
  Maybe<capnp::MessageSize> local_260;
  undefined1 local_248 [8];
  Request<capnp::AnyPointer,_capnp::AnyPointer> replacement;
  Own<capnp::ClientHook,_std::nullptr_t> *redirect;
  Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_> local_1f0;
  undefined1 local_1e0 [8];
  OwnOwn<capnp::ClientHook,_std::nullptr_t> _redirect2476;
  Exception local_1c0;
  Own<capnp::PipelineHook,_std::nullptr_t> local_30;
  Exception *local_20;
  Exception *e;
  RpcRequest *this_local;
  
  __n = &stack0xfffffffffffffc18;
  e = (Exception *)this;
  this_local = (RpcRequest *)__return_storage_ptr__;
  pRVar3 = kj::Own<capnp::_::RpcSystemBase::RpcConnectionState,_std::nullptr_t>::operator->
                     (&this->connectionState);
  bVar1 = kj::OneOf<capnp::_::RpcSystemBase::RpcConnectionState::Connected,_kj::Exception>::
          is<capnp::_::RpcSystemBase::RpcConnectionState::Connected>(&pRVar3->connection);
  if (bVar1) {
    pRVar4 = kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcClient,_std::nullptr_t>::
             operator->(&this->target);
    rpc::Call::Builder::getTarget((Builder *)&redirect,&this->callBuilder);
    (*(pRVar4->super_ClientHook)._vptr_ClientHook[10])();
    kj::_::readMaybe<capnp::ClientHook,decltype(nullptr)>((_ *)local_1e0,&local_1f0);
    kj::Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_>::~Maybe(&local_1f0);
    pOVar5 = kj::_::OwnOwn::operator_cast_to_Own_((OwnOwn *)local_1e0);
    if (pOVar5 == (Own<capnp::ClientHook,_std::nullptr_t> *)0x0) {
      pRVar3 = kj::Own<capnp::_::RpcSystemBase::RpcConnectionState,_std::nullptr_t>::operator->
                         (&this->connectionState);
      if ((pRVar3->gotReturnForHighQuestionId & 1U) == 0) {
        sendForPipelineInternal((RpcRequest *)&pipeline.ptr);
        params = kj::Own<capnp::_::RpcSystemBase::RpcConnectionState,_std::nullptr_t>::operator*
                           (&this->connectionState);
        params_1 = kj::
                   mv<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef,decltype(nullptr)>>
                             ((Own<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef,_std::nullptr_t>
                               *)&pipeline.ptr);
        kj::
        refcounted<capnp::_::RpcSystemBase::RpcConnectionState::RpcPipeline,capnp::_::RpcSystemBase::RpcConnectionState&,kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef,decltype(nullptr)>>
                  ((kj *)local_330,params,params_1);
        kj::Own<capnp::PipelineHook,decltype(nullptr)>::
        Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcPipeline,void>
                  ((Own<capnp::PipelineHook,decltype(nullptr)> *)local_320,
                   (Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcPipeline,_std::nullptr_t> *)
                   local_330);
        kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcPipeline,_std::nullptr_t>::~Own
                  ((Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcPipeline,_std::nullptr_t> *)
                   local_330);
        hook = kj::mv<kj::Own<capnp::PipelineHook,decltype(nullptr)>>
                         ((Own<capnp::PipelineHook,_std::nullptr_t> *)local_320);
        AnyPointer::Pipeline::Pipeline(__return_storage_ptr__,hook);
        local_2cc = 1;
        kj::Own<capnp::PipelineHook,_std::nullptr_t>::~Own
                  ((Own<capnp::PipelineHook,_std::nullptr_t> *)local_320);
        kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef,_std::nullptr_t>::~Own
                  ((Own<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef,_std::nullptr_t> *)
                   &pipeline.ptr);
      }
      else {
        send((RpcRequest *)&questionRef.ptr,(int)this,__buf,(size_t)__n,in_R8D);
        AnyPointer::Pipeline::Pipeline(__return_storage_ptr__,&local_2f8);
        RemotePromise<capnp::AnyPointer>::~RemotePromise
                  ((RemotePromise<capnp::AnyPointer> *)&questionRef.ptr);
        local_2cc = 1;
      }
    }
    else {
      replacement.hook.ptr =
           (RequestHook *)
           kj::_::OwnOwn<capnp::ClientHook,_std::nullptr_t>::operator*
                     ((OwnOwn<capnp::ClientHook,_std::nullptr_t> *)local_1e0);
      pCVar6 = kj::Own<capnp::ClientHook,_std::nullptr_t>::operator->
                         ((Own<capnp::ClientHook,_std::nullptr_t> *)replacement.hook.ptr);
      uVar7 = rpc::Call::Builder::getInterfaceId(&this->callBuilder);
      uVar2 = rpc::Call::Builder::getMethodId(&this->callBuilder);
      MVar8 = AnyPointer::Builder::targetSize(&this->paramsBuilder);
      local_270.wordCount = MVar8.wordCount;
      local_270.capCount = MVar8.capCount;
      kj::Maybe<capnp::MessageSize>::Maybe(&local_260,&local_270);
      rpc::Call::Builder::operator_cast_to_Reader(&local_2a8,&this->callBuilder);
      reader._reader.capTable._0_4_ = (int)local_2a8._reader.data;
      reader._reader.segment = (SegmentReader *)local_2a8._reader.capTable;
      reader._reader.capTable._4_4_ = (int)((ulong)local_2a8._reader.data >> 0x20);
      reader._reader.data._0_4_ = (int)local_2a8._reader.pointers;
      reader._reader.data._4_4_ = (int)((ulong)local_2a8._reader.pointers >> 0x20);
      reader._reader.pointers = (WirePointer *)local_2a8._reader._32_8_;
      reader._reader.dataSize = local_2a8._reader.nestingLimit;
      reader._reader.pointerCount = local_2a8._reader._44_2_;
      reader._reader._38_2_ = local_2a8._reader._46_2_;
      reader._reader._40_8_ = in_stack_fffffffffffffc48;
      local_272 = anon_unknown_18::callHintsFromReader(reader);
      (**pCVar6->_vptr_ClientHook)
                (local_248,pCVar6,uVar7,(ulong)uVar2,&local_260,(ulong)(ushort)local_272);
      kj::Maybe<capnp::MessageSize>::~Maybe(&local_260);
      AnyPointer::Builder::operator_cast_to_Reader(&local_2c8,&this->paramsBuilder);
      value.reader.capTable._0_4_ = (int)local_2c8.reader.capTable;
      value.reader.segment = local_2c8.reader.segment;
      value.reader.capTable._4_4_ = (int)((ulong)local_2c8.reader.capTable >> 0x20);
      value.reader.pointer._0_4_ = (int)local_2c8.reader.pointer;
      value.reader.pointer._4_4_ = (int)((ulong)local_2c8.reader.pointer >> 0x20);
      value.reader.nestingLimit = local_2c8.reader.nestingLimit;
      value.reader._28_4_ = local_2c8.reader._28_4_;
      AnyPointer::Builder::set((Builder *)local_248,value);
      Request<capnp::AnyPointer,_capnp::AnyPointer>::sendForPipeline
                (__return_storage_ptr__,(Request<capnp::AnyPointer,_capnp::AnyPointer> *)local_248);
      local_2cc = 1;
      Request<capnp::AnyPointer,_capnp::AnyPointer>::~Request
                ((Request<capnp::AnyPointer,_capnp::AnyPointer> *)local_248);
    }
    kj::_::OwnOwn<capnp::ClientHook,_std::nullptr_t>::~OwnOwn
              ((OwnOwn<capnp::ClientHook,_std::nullptr_t> *)local_1e0);
  }
  else {
    pRVar3 = kj::Own<capnp::_::RpcSystemBase::RpcConnectionState,_std::nullptr_t>::operator->
                       (&this->connectionState);
    local_20 = kj::OneOf<capnp::_::RpcSystemBase::RpcConnectionState::Connected,_kj::Exception>::
               get<kj::Exception>(&pRVar3->connection);
    kj::cp<kj::Exception>(&local_1c0,local_20);
    newBrokenPipeline((capnp *)&local_30,&local_1c0);
    AnyPointer::Pipeline::Pipeline(__return_storage_ptr__,&local_30);
    kj::Own<capnp::PipelineHook,_std::nullptr_t>::~Own(&local_30);
    kj::Exception::~Exception(&local_1c0);
  }
  return __return_storage_ptr__;
}

Assistant:

AnyPointer::Pipeline sendForPipeline() override {
      if (!connectionState->connection.is<Connected>()) {
        // Connection is broken.
        // TODO(bug): Seems like we should check for redirect before this?
        const kj::Exception& e = connectionState->connection.get<Disconnected>();
        return AnyPointer::Pipeline(newBrokenPipeline(kj::cp(e)));
      }

      KJ_IF_SOME(redirect, target->writeTarget(callBuilder.getTarget())) {
        // Whoops, this capability has been redirected while we were building the request!
        // We'll have to make a new request and do a copy.  Ick.

        auto replacement = redirect->newCall(
            callBuilder.getInterfaceId(), callBuilder.getMethodId(), paramsBuilder.targetSize(),
            callHintsFromReader(callBuilder));
        replacement.set(paramsBuilder);
        return replacement.sendForPipeline();
      } else if (connectionState->gotReturnForHighQuestionId) {
        // Peer doesn't implement our hints. Fall back to a regular send().
        return send();
      } else {
        auto questionRef = sendForPipelineInternal();
        kj::Own<PipelineHook> pipeline = kj::refcounted<RpcPipeline>(
            *connectionState, kj::mv(questionRef));
        return AnyPointer::Pipeline(kj::mv(pipeline));
      }